

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O1

void pnga_matmul_patch_alt
               (char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
               Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,Integer g_c,Integer *clo,
               Integer *chi)

{
  long lVar1;
  long lVar2;
  Integer IVar3;
  Integer IVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Integer brank;
  Integer arank;
  char *local_d0;
  char *local_c8;
  void *local_c0;
  Integer btype;
  Integer atype;
  Integer bdims [7];
  Integer adims [7];
  
  uVar5 = (byte)*transa | 0x20;
  local_d0 = transa;
  local_c8 = transb;
  local_c0 = alpha;
  if (uVar5 == 0x74) {
    pnga_inquire(g_a,&atype,&arank,adims);
    uVar5 = 0xffffffff;
    if (2 < arank) {
      lVar7 = 0;
      uVar5 = 0xffffffff;
      uVar9 = 0xffffffff;
      iVar8 = 0;
      do {
        lVar1 = ahi[lVar7];
        lVar2 = alo[lVar7];
        if (uVar9 == 0xffffffff && lVar2 < lVar1) {
          iVar8 = iVar8 + 1;
          uVar9 = (uint)lVar7;
        }
        else if (uVar5 == 0xffffffff && lVar2 < lVar1) {
          iVar8 = iVar8 + 1;
          uVar5 = (uint)lVar7;
        }
        else if (lVar2 < lVar1) {
          pnga_error("Patch A has more than 2 dimensions",0);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < arank);
      uVar5 = 0xffffffff;
      if (iVar8 == 1) {
        uVar5 = uVar9;
      }
    }
    IVar3 = *ahi;
    IVar4 = *alo;
    *alo = alo[1];
    *ahi = ahi[1];
    alo[1] = IVar4;
    ahi[1] = IVar3;
  }
  pnga_inquire(g_b,&btype,&brank,bdims);
  if (brank < 3) {
    IVar3 = *bhi;
    IVar4 = *blo;
    *blo = blo[1];
    *bhi = bhi[1];
    blo[1] = IVar4;
    bhi[1] = IVar3;
    iVar8 = -1;
  }
  else {
    uVar9 = 0;
    if (brank < 1) {
      iVar10 = -1;
      iVar11 = -1;
    }
    else {
      iVar11 = -1;
      lVar7 = 0;
      iVar10 = -1;
      do {
        lVar1 = bhi[lVar7];
        lVar2 = blo[lVar7];
        if (iVar10 == -1 && lVar2 < lVar1) {
          uVar9 = uVar9 + 1;
          iVar10 = (int)lVar7;
        }
        else if (iVar11 == -1 && lVar2 < lVar1) {
          uVar9 = uVar9 + 1;
          iVar11 = (int)lVar7;
        }
        else if (lVar2 < lVar1) {
          pnga_error("Patch A has more than 2 dimensions",0);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < brank);
      uVar9 = (uint)(uVar9 == 1);
    }
    iVar6 = iVar10;
    iVar8 = -1;
    if ((char)uVar9 != '\0') {
      iVar8 = iVar10;
      if ((long)iVar10 < arank + -1) {
        iVar11 = iVar10 + 1;
      }
      else {
        iVar6 = iVar10 + -1;
        iVar11 = iVar10;
      }
    }
    IVar3 = blo[iVar6];
    IVar4 = bhi[iVar6];
    blo[iVar6] = blo[iVar11];
    bhi[iVar6] = bhi[iVar11];
    blo[iVar11] = IVar3;
    bhi[iVar11] = IVar4;
  }
  gai_matmul_patch(local_d0,local_c8,local_c0,beta,g_a,alo,ahi,uVar5,g_b,blo,bhi,iVar8,g_c,clo,chi);
  return;
}

Assistant:

void pnga_matmul_patch_alt(char *transa, char *transb, void *alpha, void *beta, 
    Integer g_a, Integer alo[], Integer ahi[], 
    Integer g_b, Integer blo[], Integer bhi[], 
    Integer g_c, Integer clo[], Integer chi[])
{
  int aivec, bivec;
  int e, d, ipos, jpos;
  Integer atype, btype, arank, brank, lo, hi;
  Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM];
  /* if the patch is transposed, find the two indices that correspond to the
   * non-unit dimensions */
  if (*transa == 't' || *transa == 'T') {
    pnga_inquire(g_a, &atype, &arank, adims);
    aivec = -1;
    if (arank > 2) {
      ipos = -1;
      jpos = -1;
      e = 0;
      /* find out how many patch dimensions are greater than 1*/
      for (d=0; d<arank; d++) {
        if (ahi[d]-alo[d] > 0 && ipos == -1) {
          ipos = d;
          e++;
        } else if (ahi[d]-alo[d] > 0 && jpos == -1) {
          jpos = d;
          e++;
        } else if (ahi[d]-alo[d] > 0) {
          pnga_error("Patch A has more than 2 dimensions",0);
        }
      }
      if (e == 0) {
        aivec = -1;
      } else if (e == 1) {
        /* array is a vector */
        aivec = ipos;
        if (ipos < arank-1) {
          jpos = ipos + 1;
        } else {
          jpos = ipos;
          ipos--;
        }
      } else {
        aivec = -1;
      }
    }
    lo = alo[0];
    hi = ahi[0];
    alo[0] = alo[1];
    ahi[0] = ahi[1];
    alo[1] = lo;
    ahi[1] = hi;
  }
  if (*transb == 't' || *transb == 'T') {
    pnga_inquire(g_b, &btype, &brank, bdims);
    bivec = -1;
    if (brank > 2) {
      ipos = -1;
      jpos = -1;
      e = 0;
      /* find out how many patch dimensions are greater than 1*/
      for (d=0; d<brank; d++) {
        if (bhi[d]-blo[d] > 0 && ipos == -1) {
          ipos = d;
          e++;
        } else if (bhi[d]-blo[d] > 0 && jpos == -1) {
          jpos = d;
          e++;
        } else if (bhi[d]-blo[d] > 0) {
          pnga_error("Patch A has more than 2 dimensions",0);
        }
      }
      if (e == 0) {
        bivec = -1;
      } else if (e == 1) {
        /* array is a vector */
        bivec = ipos;
        if (ipos < arank-1) {
          jpos = ipos + 1;
        } else {
          jpos = ipos;
          ipos--;
        }
      } else {
        bivec = -1;
      }
      lo = blo[ipos];
      hi = bhi[ipos];
      blo[ipos] = blo[jpos];
      bhi[ipos] = bhi[jpos];
      blo[jpos] = lo;
      bhi[jpos] = hi;
    } else {
      lo = blo[0];
      hi = bhi[0];
      blo[0] = blo[1];
      bhi[0] = bhi[1];
      blo[1] = lo;
      bhi[1] = hi;
    }
  }


  gai_matmul_patch(transa,transb,alpha,beta,g_a,alo,ahi,aivec,
    g_b,blo,bhi,bivec,g_c,clo,chi);
}